

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O0

void __thiscall
TPZCompElDisc::Shape
          (TPZCompElDisc *this,TPZVec<double> *qsi,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  TPZGeoEl *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  TPZCompEl *in_RDI;
  TPZManVector<double,_4> x;
  int64_t in_stack_ffffffffffffff98;
  TPZManVector<double,_4> *in_stack_ffffffffffffffa0;
  
  if ((undefined1  [40])((undefined1  [40])in_RDI[2] & (undefined1  [40])0x1) ==
      (undefined1  [40])0x1) {
    (**(code **)(*(long *)in_RDI + 0x330))(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  else {
    TPZManVector<double,_4>::TPZManVector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    this_00 = TPZCompEl::Reference(in_RDI);
    (**(code **)(*(long *)this_00 + 0x228))(this_00,in_RSI,&stack0xffffffffffffffa0);
    (**(code **)(*(long *)in_RDI + 0x330))(in_RDI,&stack0xffffffffffffffa0,in_RDX,in_RCX);
    TPZManVector<double,_4>::~TPZManVector((TPZManVector<double,_4> *)this_00);
  }
  return;
}

Assistant:

void TPZCompElDisc::Shape(TPZVec<REAL> &qsi,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
    if(fUseQsiEta==true){
        this->ShapeX(qsi,phi,dphi);
    }else{

        TPZManVector<REAL,4> x(3);
        this->Reference()->X(qsi,x);
        this->ShapeX(x,phi,dphi);
    }
}